

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O2

void __thiscall
uWS::TopicTree::TopicTree
          (TopicTree *this,
          function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
          *cb)

{
  Topic *this_00;
  
  (this->cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->cb)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->cb).super__Function_base._M_functor + 8) = 0;
  this_00 = (Topic *)operator_new(0xc0);
  Topic::Topic(this_00);
  this->root = this_00;
  this->messageId = 0;
  this->numTriggeredTopics = 0;
  this->min = (Subscriber *)0xffffffffffffffff;
  std::
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  ::operator=(&this->cb,cb);
  return;
}

Assistant:

TopicTree(std::function<int(Subscriber *, std::pair<std::string_view, std::string_view>)> cb) {
        this->cb = cb;
    }